

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockBuilderCopyWindowSettings(char *src_name,char *dst_name)

{
  ImU32 IVar1;
  void *pvVar2;
  void *pvVar3;
  ImGuiWindowSettings *pIVar4;
  ImGuiStorage *this;
  
  IVar1 = ImHashStr(src_name,0,0);
  this = &GImGui->WindowsById;
  pvVar2 = ImGuiStorage::GetVoidPtr(this,IVar1);
  if (pvVar2 != (void *)0x0) {
    IVar1 = ImHashStr(dst_name,0,0);
    pvVar3 = ImGuiStorage::GetVoidPtr(this,IVar1);
    if (pvVar3 == (void *)0x0) {
      pIVar4 = FindOrCreateWindowSettings(dst_name);
      if (pIVar4 != (ImGuiWindowSettings *)0x0) {
        if ((*(int *)((long)pvVar2 + 0x38) == 0) || (*(int *)((long)pvVar2 + 0x38) == 0x11111111)) {
          pIVar4->Pos = (ImVec2ih)
                        ((int)*(float *)((long)pvVar2 + 0x48) & 0xffffU |
                        (int)*(float *)((long)pvVar2 + 0x4c) << 0x10);
        }
        else {
          pIVar4->ViewportPos =
               (ImVec2ih)
               ((int)*(float *)((long)pvVar2 + 0x48) & 0xffffU |
               (int)*(float *)((long)pvVar2 + 0x4c) << 0x10);
          pIVar4->ViewportId = *(ImGuiID *)((long)pvVar2 + 0x38);
          (pIVar4->Pos).x = 0;
          (pIVar4->Pos).y = 0;
        }
        pIVar4->Size = (ImVec2ih)
                       ((int)*(float *)((long)pvVar2 + 0x58) & 0xffffU |
                       (int)*(float *)((long)pvVar2 + 0x5c) << 0x10);
        pIVar4->Collapsed = *(bool *)((long)pvVar2 + 0xc2);
      }
    }
    else {
      *(undefined8 *)((long)pvVar3 + 0x48) = *(undefined8 *)((long)pvVar2 + 0x48);
      *(undefined8 *)((long)pvVar3 + 0x50) = *(undefined8 *)((long)pvVar2 + 0x50);
      *(undefined8 *)((long)pvVar3 + 0x58) = *(undefined8 *)((long)pvVar2 + 0x58);
      *(undefined1 *)((long)pvVar3 + 0xc2) = *(undefined1 *)((long)pvVar2 + 0xc2);
    }
  }
  return;
}

Assistant:

void ImGui::DockBuilderCopyWindowSettings(const char* src_name, const char* dst_name)
{
    ImGuiWindow* src_window = FindWindowByName(src_name);
    if (src_window == NULL)
        return;
    if (ImGuiWindow* dst_window = FindWindowByName(dst_name))
    {
        dst_window->Pos = src_window->Pos;
        dst_window->Size = src_window->Size;
        dst_window->SizeFull = src_window->SizeFull;
        dst_window->Collapsed = src_window->Collapsed;
    }
    else if (ImGuiWindowSettings* dst_settings = FindOrCreateWindowSettings(dst_name))
    {
        ImVec2ih window_pos_2ih = ImVec2ih(src_window->Pos);
        if (src_window->ViewportId != 0 && src_window->ViewportId != IMGUI_VIEWPORT_DEFAULT_ID)
        {
            dst_settings->ViewportPos = window_pos_2ih;
            dst_settings->ViewportId = src_window->ViewportId;
            dst_settings->Pos = ImVec2ih(0, 0);
        }
        else
        {
            dst_settings->Pos = window_pos_2ih;
        }
        dst_settings->Size = ImVec2ih(src_window->SizeFull);
        dst_settings->Collapsed = src_window->Collapsed;
    }
}